

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeRunJustOnce(Parse *pParse,Expr *pExpr,int regDest)

{
  Vdbe *p_00;
  int iVar1;
  Expr *pExpr_00;
  ExprList *pEVar2;
  ExprList_item *pItem_1;
  int addr;
  Vdbe *v;
  ExprList_item *pEStack_38;
  int i;
  ExprList_item *pItem;
  ExprList *p;
  int regDest_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pEVar2 = pParse->pConstExpr;
  if ((regDest < 0) && (pEVar2 != (ExprList *)0x0)) {
    pEStack_38 = pEVar2->a;
    for (v._4_4_ = pEVar2->nExpr; 0 < v._4_4_; v._4_4_ = v._4_4_ + -1) {
      if (((*(ushort *)&(pEStack_38->fg).field_0x1 >> 3 & 1) != 0) &&
         (iVar1 = sqlite3ExprCompare((Parse *)0x0,pEStack_38->pExpr,pExpr,-1), iVar1 == 0)) {
        return (pEStack_38->u).iConstExprReg;
      }
      pEStack_38 = pEStack_38 + 1;
    }
  }
  pExpr_00 = sqlite3ExprDup(pParse->db,pExpr,0);
  p._4_4_ = regDest;
  if ((pExpr_00 == (Expr *)0x0) || ((pExpr_00->flags & 8) == 0)) {
    pEVar2 = sqlite3ExprListAppend(pParse,pEVar2,pExpr_00);
    if (pEVar2 != (ExprList *)0x0) {
      iVar1 = pEVar2->nExpr + -1;
      *(ushort *)&pEVar2->a[iVar1].fg.field_0x1 =
           *(ushort *)&pEVar2->a[iVar1].fg.field_0x1 & 0xfff7 | (ushort)(regDest < 0) << 3;
      if (regDest < 0) {
        p._4_4_ = pParse->nMem + 1;
        pParse->nMem = p._4_4_;
      }
      pEVar2->a[iVar1].u.iConstExprReg = p._4_4_;
    }
    pParse->pConstExpr = pEVar2;
  }
  else {
    p_00 = pParse->pVdbe;
    iVar1 = sqlite3VdbeAddOp0(p_00,0xf);
    pParse->okConstFactor = '\0';
    if (pParse->db->mallocFailed == '\0') {
      if (regDest < 0) {
        p._4_4_ = pParse->nMem + 1;
        pParse->nMem = p._4_4_;
      }
      sqlite3ExprCode(pParse,pExpr_00,p._4_4_);
    }
    pParse->okConstFactor = '\x01';
    sqlite3ExprDelete(pParse->db,pExpr_00);
    sqlite3VdbeJumpHere(p_00,iVar1);
  }
  return p._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeRunJustOnce(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->fg.reusable
       && sqlite3ExprCompare(0,pItem->pExpr,pExpr,-1)==0
      ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  if( pExpr!=0 && ExprHasProperty(pExpr, EP_HasFunc) ){
    Vdbe *v = pParse->pVdbe;
    int addr;
    assert( v );
    addr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    pParse->okConstFactor = 0;
    if( !pParse->db->mallocFailed ){
      if( regDest<0 ) regDest = ++pParse->nMem;
      sqlite3ExprCode(pParse, pExpr, regDest);
    }
    pParse->okConstFactor = 1;
    sqlite3ExprDelete(pParse->db, pExpr);
    sqlite3VdbeJumpHere(v, addr);
  }else{
    p = sqlite3ExprListAppend(pParse, p, pExpr);
    if( p ){
       struct ExprList_item *pItem = &p->a[p->nExpr-1];
       pItem->fg.reusable = regDest<0;
       if( regDest<0 ) regDest = ++pParse->nMem;
       pItem->u.iConstExprReg = regDest;
    }
    pParse->pConstExpr = p;
  }
  return regDest;
}